

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void __thiscall
testing::internal::
AllOfMatcherImpl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
::DescribeTo(AllOfMatcherImpl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             *this,ostream *os)

{
  size_t i;
  ulong uVar1;
  pointer pMVar2;
  long lVar3;
  
  std::operator<<(os,"(");
  lVar3 = 0;
  for (uVar1 = 0;
      pMVar2 = (this->matchers_).
               super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar1 < (ulong)(((long)(this->matchers_).
                             super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x18);
      uVar1 = uVar1 + 1) {
    if (uVar1 != 0) {
      std::operator<<(os,") and (");
      pMVar2 = (this->matchers_).
               super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::DescribeTo((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)((long)&(pMVar2->
                            super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                            ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                    lVar3),os);
    lVar3 = lVar3 + 0x18;
  }
  std::operator<<(os,")");
  return;
}

Assistant:

void DescribeTo(::std::ostream* os) const override {
    *os << "(";
    for (size_t i = 0; i < matchers_.size(); ++i) {
      if (i != 0) *os << ") and (";
      matchers_[i].DescribeTo(os);
    }
    *os << ")";
  }